

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::~ArrayBuilder
          (ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *this)

{
  UnfinishedValue *pUVar1;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar2;
  UnfinishedValue *pUVar3;
  
  pUVar1 = this->ptr;
  if (pUVar1 != (UnfinishedValue *)0x0) {
    pRVar2 = this->pos;
    pUVar3 = this->endPtr;
    this->ptr = (UnfinishedValue *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
    this->endPtr = (UnfinishedValue *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pUVar1,0x98,((long)pRVar2 - (long)pUVar1 >> 3) * -0x79435e50d79435e5,
               ((long)pUVar3 - (long)pUVar1 >> 3) * -0x79435e50d79435e5,
               ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::UnfinishedValue>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }